

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::
MapAllocator<std::_Rb_tree_node<std::__cxx11::string*>>::
construct<std::__cxx11::string*,std::__cxx11::string*>
          (MapAllocator<std::_Rb_tree_node<std::__cxx11::string*>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **p,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **p_local;
  MapAllocator<std::_Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *this_local;
  
  *p = *args;
  return;
}

Assistant:

void construct(NodeType* p, Args&&... args) {
      // Clang 3.6 doesn't compile static casting to void* directly. (Issue
      // #1266) According C++ standard 5.2.9/1: "The static_cast operator shall
      // not cast away constness". So first the maybe const pointer is casted to
      // const void* and after the const void* is const casted.
      new (const_cast<void*>(static_cast<const void*>(p)))
          NodeType(std::forward<Args>(args)...);
    }